

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_42(QPDF *pdf,char *arg2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  char cVar12;
  bool bVar13;
  __type_conflict1 _Var14;
  int iVar15;
  undefined4 uVar16;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  undefined4 extraout_EAX_03;
  undefined4 extraout_EAX_04;
  undefined4 extraout_EAX_05;
  long *plVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long lVar18;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var19;
  QPDFObjGen QVar20;
  undefined8 uVar21;
  int iVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  QPDFObjectHandle QVar27;
  QPDFObjectHandle QVar28;
  Pl_Buffer pl1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_260 [2];
  Rectangle r0;
  Matrix m1;
  QPDFObjectHandle array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  QPDFObjectHandle integer;
  Rectangle r1;
  QPDFObjGen indirect_og;
  QPDFObjectHandle indirect;
  QPDFObjectHandle dictionary;
  QPDFObjectHandle qtest;
  QPDFObjectHandle null;
  QPDFObjectHandle matrix;
  string local_108;
  QPDFObjectHandle uninitialized;
  char local_d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  QPDFObjectHandle rect;
  QPDFObjectHandle page;
  undefined1 local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  string local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  string local_38 [32];
  
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>((string *)&pl1,"/QTest",(allocator<char> *)&r0)
  ;
  QPDFObjectHandle::getKey((string *)&qtest);
  std::__cxx11::string::~string((string *)&pl1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m1.b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pl1,"/Dictionary",(allocator<char> *)&r1);
  QPDFObjectHandle::getKey((string *)&r0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m1,"/Key2",(allocator<char> *)&local_1b8);
  QPDFObjectHandle::getKey((string *)&array);
  std::__cxx11::string::~string((string *)&m1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r0.lly);
  std::__cxx11::string::~string((string *)&pl1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pl1,"/Dictionary",(allocator<char> *)&m1);
  QPDFObjectHandle::getKey((string *)&dictionary);
  std::__cxx11::string::~string((string *)&pl1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pl1,"/Integer",(allocator<char> *)&m1);
  QPDFObjectHandle::getKey((string *)&integer);
  std::__cxx11::string::~string((string *)&pl1);
  QPDFObjectHandle::newNull();
  cVar12 = QPDFObjectHandle::isArray();
  if (cVar12 == '\0') {
    __assert_fail("array.isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x584,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::aitems();
  QPDFObjectHandle::QPDFArrayItems::begin();
  QPDFObjectHandle::QPDFArrayItems::iterator::operator->((iterator *)&pl1);
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m1,
                           "/Item0");
  if (!bVar13) {
    __assert_fail("i->getName() == \"/Item0\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x589,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&m1);
  plVar17 = (long *)QPDFObjectHandle::QPDFArrayItems::iterator::operator*((iterator *)&pl1);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator--((iterator *)&pl1);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator->((iterator *)&pl1);
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m1,
                           "/Item0");
  if (!bVar13) {
    __assert_fail("i->getName() == \"/Item0\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x58c,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&m1);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)&pl1);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)&pl1);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)&pl1);
  QPDFObjectHandle::QPDFArrayItems::end();
  cVar12 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==((iterator *)&pl1,(iterator *)&m1);
  if (cVar12 == '\0') {
    __assert_fail("i == ai.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x590,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&m1);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)&pl1);
  QPDFObjectHandle::QPDFArrayItems::end();
  cVar12 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==((iterator *)&pl1,(iterator *)&m1);
  if (cVar12 == '\0') {
    __assert_fail("i == ai.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x592,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&m1);
  if (*plVar17 != 0) {
    __assert_fail("!i_value",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x593,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::operator--((iterator *)&pl1);
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m1,
                           "/Item2");
  if (!bVar13) {
    __assert_fail("i_value.getName() == \"/Item2\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x595,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&m1);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator->((iterator *)&pl1);
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m1,
                           "/Item2");
  if (!bVar13) {
    __assert_fail("i->getName() == \"/Item2\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x596,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&m1);
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&pl1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r0.lly);
  cVar12 = QPDFObjectHandle::isDictionary();
  if (cVar12 == '\0') {
    __assert_fail("dictionary.isDictionary()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x598,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::ditems();
  QPDFObjectHandle::QPDFDictItems::begin();
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          QPDFObjectHandle::QPDFDictItems::iterator::operator->[abi_cxx11_();
  bVar13 = std::operator==(__lhs,"/Key1");
  if (!bVar13) {
    __assert_fail("i->first == \"/Key1\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x59d,"void test_42(QPDF &, const char *)");
  }
  lVar18 = QPDFObjectHandle::QPDFDictItems::iterator::operator*[abi_cxx11_();
  QPDFObjectHandle::QPDFDictItems::iterator::operator->[abi_cxx11_();
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m1,
                           "/Value1");
  if (!bVar13) {
    __assert_fail("i->second.getName() == \"/Value1\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x59f,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&m1);
  QPDFObjectHandle::QPDFDictItems::iterator::operator++((iterator *)&pl1);
  QPDFObjectHandle::QPDFDictItems::iterator::operator++((iterator *)&pl1);
  QPDFObjectHandle::QPDFDictItems::end();
  cVar12 = QPDFObjectHandle::QPDFDictItems::iterator::operator==((iterator *)&pl1,(iterator *)&m1);
  if (cVar12 == '\0') {
    __assert_fail("i == di.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5a2,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFDictItems::iterator::~iterator((iterator *)&m1);
  if (*(long *)(lVar18 + 0x20) != 0) {
    __assert_fail("!i_value.second",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5a3,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFDictItems::iterator::~iterator((iterator *)&pl1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r0.lly);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  bVar13 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &pl1);
  if (!bVar13) {
    __assert_fail("\"\" == qtest.getStringValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5a5,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&pl1);
  iVar22 = (int)&pl1;
  QPDFObjectHandle::getArrayItem(iVar22);
  QPDFObjectHandle::assertNull();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
  QPDFObjectHandle::getArrayItem(iVar22);
  QPDFObjectHandle::assertNull();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
  QPDFObjectHandle::getArrayItem(iVar22);
  QPDFObjectHandle::assertNull();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
  QPDFObjectHandle::appendItem(&integer);
  QPDFObjectHandle::eraseItem((int)&array);
  QPDFObjectHandle::eraseItem((int)&array);
  operator____qpdf((char *)&pl1,0x13da3d);
  QPDFObjectHandle::insertItem((int)&array,(QPDFObjectHandle *)0x2a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
  operator____qpdf((char *)&pl1,0x13da3d);
  QPDFObjectHandle::setArrayItem((int)&array,(QPDFObjectHandle *)0x2a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
  QPDFObjectHandle::eraseItem((int)&integer);
  QPDFObjectHandle::insertItem((int)&integer,(QPDFObjectHandle *)0x0);
  _pl1 = (pointer)0x0;
  _Stack_280._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_278._M_allocated_capacity = 0;
  QPDFObjectHandle::setArrayFromVector((vector *)&integer);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&pl1);
  QPDFObjectHandle::setArrayItem((int)&integer,(QPDFObjectHandle *)0x0);
  iVar15 = QPDFObjectHandle::getArrayNItems();
  if (iVar15 != 0) {
    __assert_fail("0 == integer.getArrayNItems()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b2,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::getArrayAsVector();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_pl1 != _Stack_280._M_pi) {
    __assert_fail("integer.getArrayAsVector().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b3,"void test_42(QPDF &, const char *)");
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&pl1);
  cVar12 = QPDFObjectHandle::getBoolValue();
  if (cVar12 != '\0') {
    __assert_fail("false == integer.getBoolValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b4,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::getDictAsMap_abi_cxx11_();
  if (aaStack_260[0]._M_allocated_capacity != 0) {
    __assert_fail("integer.getDictAsMap().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b5,"void test_42(QPDF &, const char *)");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
               *)&pl1);
  QPDFObjectHandle::getKeys_abi_cxx11_();
  if (aaStack_260[0]._M_allocated_capacity != 0) {
    __assert_fail("integer.getKeys().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b6,"void test_42(QPDF &, const char *)");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pl1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pl1,"/Potato",(allocator<char> *)&m1);
  cVar12 = QPDFObjectHandle::hasKey((string *)&integer);
  if (cVar12 != '\0') {
    __assert_fail("false == integer.hasKey(\"/Potato\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b7,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&pl1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pl1,"/Potato",(allocator<char> *)&m1);
  QPDFObjectHandle::removeKey((string *)&integer);
  std::__cxx11::string::~string((string *)&pl1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pl1,"/Potato",(allocator<char> *)&m1);
  QPDFObjectHandle::replaceKey((string *)&integer,(QPDFObjectHandle *)&pl1);
  std::__cxx11::string::~string((string *)&pl1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pl1,"/Potato",(allocator<char> *)&r0);
  QPDFObjectHandle::newInteger((longlong)&m1);
  QPDFObjectHandle::replaceKey((string *)&integer,(QPDFObjectHandle *)&pl1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m1.b);
  std::__cxx11::string::~string((string *)&pl1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pl1,"/Integer",(allocator<char> *)&local_1b8);
  QPDFObjectHandle::getKeyIfDict((string *)&r1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m1,"/Potato",(allocator<char> *)&local_108);
  QPDFObjectHandle::getKeyIfDict((string *)&r0);
  QPDFObjectHandle::assertNull();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r0.lly);
  std::__cxx11::string::~string((string *)&m1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r1.lly);
  std::__cxx11::string::~string((string *)&pl1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pl1,"/Integer",(allocator<char> *)&r1);
  QPDFObjectHandle::getKey((string *)&r0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m1,"/Potato",(allocator<char> *)&local_1b8);
  QPDFObjectHandle::getKeyIfDict(local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__cxx11::string::~string((string *)&m1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r0.lly);
  std::__cxx11::string::~string((string *)&pl1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pl1,"/Integer",(allocator<char> *)&r1);
  QPDFObjectHandle::getKey((string *)&r0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m1,"/Potato",(allocator<char> *)&local_1b8);
  QPDFObjectHandle::getKey(local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__cxx11::string::~string((string *)&m1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r0.lly);
  std::__cxx11::string::~string((string *)&pl1);
  QPDFObjectHandle::getInlineImageValue_abi_cxx11_();
  if (_Stack_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("integer.getInlineImageValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5be,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&pl1);
  lVar18 = QPDFObjectHandle::getIntValue();
  if (lVar18 != 0) {
    __assert_fail("0 == dictionary.getIntValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5bf,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar13 = std::operator==("/QPDFFakeName",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pl1
                          );
  if (!bVar13) {
    __assert_fail("\"/QPDFFakeName\" == integer.getName()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c0,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&pl1);
  QPDFObjectHandle::getOperatorValue_abi_cxx11_();
  bVar13 = std::operator==("QPDFFAKE",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pl1
                          );
  if (!bVar13) {
    __assert_fail("\"QPDFFAKE\" == integer.getOperatorValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c1,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&pl1);
  QPDFObjectHandle::getRealValue_abi_cxx11_();
  bVar13 = std::operator==("0.0",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&pl1);
  if (!bVar13) {
    __assert_fail("\"0.0\" == dictionary.getRealValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c2,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&pl1);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if (_Stack_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("integer.getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c3,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&pl1);
  QPDFObjectHandle::getUTF8Value_abi_cxx11_();
  if (_Stack_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("integer.getUTF8Value().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c4,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&pl1);
  dVar23 = (double)QPDFObjectHandle::getNumericValue();
  if ((dVar23 != 0.0) || (NAN(dVar23))) {
    __assert_fail("0.0 == dictionary.getNumericValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c5,"void test_42(QPDF &, const char *)");
  }
  std::operator<<((ostream *)&std::cerr,"One error\n");
  QPDFObjectHandle::getArrayItem((int)&m1);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if (_Stack_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("array.getArrayItem(0).getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c8,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&pl1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m1.b);
  std::operator<<((ostream *)&std::cerr,"One error\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&m1,"/Quack",(allocator<char> *)&r1);
  QPDFObjectHandle::getKey((string *)&r0);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if (_Stack_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("dictionary.getKey(\"/Quack\").getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5ca,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&pl1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r0.lly);
  std::__cxx11::string::~string((string *)&m1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&m1,"/Quack",(allocator<char> *)&r1);
  QPDFObjectHandle::getKeyIfDict((string *)&r0);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if (_Stack_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("dictionary.getKeyIfDict(\"/Quack\").getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cb,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&pl1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r0.lly);
  std::__cxx11::string::~string((string *)&m1);
  QPDFObjectHandle::getArrayItem(iVar22);
  cVar12 = QPDFObjectHandle::isDictionary();
  if (cVar12 == '\0') {
    __assert_fail("array.getArrayItem(1).isDictionary()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cc,"void test_42(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
  QPDFObjectHandle::getArrayItem((int)&r0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&pl1,"/K",(allocator<char> *)&r1);
  QPDFObjectHandle::getKey((string *)&m1);
  cVar12 = QPDFObjectHandle::isArray();
  if (cVar12 == '\0') {
    __assert_fail("array.getArrayItem(1).getKey(\"/K\").isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cd,"void test_42(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m1.b);
  std::__cxx11::string::~string((string *)&pl1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r0.lly);
  QPDFObjectHandle::getArrayItem((int)&r1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pl1,"/K",(allocator<char> *)&local_1b8);
  QPDFObjectHandle::getKey((string *)&r0);
  QPDFObjectHandle::getArrayItem((int)&m1);
  cVar12 = QPDFObjectHandle::isName();
  if (cVar12 == '\0') {
    __assert_fail("array.getArrayItem(1).getKey(\"/K\").getArrayItem(0).isName()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5ce,"void test_42(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m1.b);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r0.lly);
  std::__cxx11::string::~string((string *)&pl1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r1.lly);
  QPDFObjectHandle::getArrayItem((int)&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m1,"/K",(allocator<char> *)&local_108);
  QPDFObjectHandle::getKey((string *)&r1);
  QPDFObjectHandle::getArrayItem((int)&r0);
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar13 = std::operator==("/V",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&pl1);
  if (!bVar13) {
    __assert_fail("\"/V\" == array.getArrayItem(1).getKey(\"/K\").getArrayItem(0).getName()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cf,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&pl1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r0.lly);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r1.lly);
  std::__cxx11::string::~string((string *)&m1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b8._M_string_length);
  std::operator<<((ostream *)&std::cerr,"Two errors\n");
  QPDFObjectHandle::getArrayItem((int)&m1);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if (_Stack_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("array.getArrayItem(16059).getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5d1,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&pl1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m1.b);
  std::operator<<((ostream *)&std::cerr,"One error\n");
  QPDFObjectHandle::getArrayItem((int)&r1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pl1,"/K",(allocator<char> *)&local_1b8);
  QPDFObjectHandle::getKey((string *)&r0);
  QPDFObjectHandle::getArrayItem((int)&m1);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  std::__cxx11::string::~string(local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m1.b);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r0.lly);
  std::__cxx11::string::~string((string *)&pl1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r1.lly);
  this = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  p_Var19 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page,p_Var19);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m1,"/Contents",(allocator<char> *)&local_78);
  QPDFObjectHandle::getKey((string *)&local_108);
  QPDFObjectHandle::getDict();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&r0,"/Potato",(allocator<char> *)&local_98);
  QPDFObjectHandle::getKey((string *)&r1);
  QPDFObjectHandle::getName_abi_cxx11_();
  bVar13 = std::operator==("/QPDFFakeName",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pl1
                          );
  if (!bVar13) {
    __assert_fail("\"/QPDFFakeName\" == page.getKey(\"/Contents\").getDict().getKey(\"/Potato\").getName()"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5d6,"void test_42(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&pl1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r1.lly);
  std::__cxx11::string::~string((string *)&r0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b8._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108._M_string_length);
  std::__cxx11::string::~string((string *)&m1);
  uVar16 = QPDFObjectHandle::getArrayAsRectangle();
  auVar1._4_4_ = -(uint)(r0.lly != 0.0);
  auVar1._0_4_ = -(uint)(r0.llx != 0.0);
  auVar1._8_4_ = -(uint)(r0.urx != 0.0);
  auVar1._12_4_ = -(uint)(r0.ury != 0.0);
  iVar15 = movmskps(uVar16,auVar1);
  if (iVar15 != 0) {
    __assert_fail("(r0.llx == 0) && (r0.lly == 0) && (r0.urx == 0) && (r0.ury == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5d9,"void test_42(QPDF &, const char *)");
  }
  _pl1 = (pointer)0x3ff3333333333333;
  _Stack_280._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x400b333333333333;
  local_278._M_allocated_capacity = 0x4016666666666666;
  local_278._8_8_ = (element_type *)0x401f333333333333;
  QPDFObjectHandle::newFromRectangle((Rectangle *)&rect);
  uVar16 = QPDFObjectHandle::getArrayAsRectangle();
  auVar24._4_4_ = -(uint)(r1.lly <= 3.39);
  auVar24._0_4_ = -(uint)(r1.llx <= 1.19);
  auVar24._8_4_ = -(uint)(r1.urx <= 5.59);
  auVar24._12_4_ = -(uint)(r1.ury <= 7.79);
  auVar11._4_4_ = -(uint)(3.41 <= r1.lly);
  auVar11._0_4_ = -(uint)(1.21 <= r1.llx);
  auVar11._8_4_ = -(uint)(5.61 <= r1.urx);
  auVar11._12_4_ = -(uint)(7.81 <= r1.ury);
  iVar15 = movmskps(uVar16,auVar24 | auVar11);
  if (iVar15 != 0) {
    __assert_fail("(r1.llx > 1.19) && (r1.llx < 1.21) && (r1.lly > 3.39) && (r1.lly < 3.41) && (r1.urx > 5.59) && (r1.urx < 5.61) && (r1.ury > 7.79) && (r1.ury < 7.81)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5df,"void test_42(QPDF &, const char *)");
  }
  operator____qpdf((char *)&pl1,0x13df32);
  cVar12 = QPDFObjectHandle::isRectangle();
  if (cVar12 != '\0') {
    __assert_fail("!\"[1 2 3 4 5]\"_qpdf.isRectangle()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5e0,"void test_42(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
  operator____qpdf((char *)&m1,0x13df32);
  QPDFObjectHandle::getArrayAsRectangle();
  r1.urx = (double)local_278._M_allocated_capacity;
  r1.ury = (double)local_278._8_8_;
  r1.llx = (double)_pl1;
  r1.lly = (double)_Stack_280._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m1.b);
  auVar2._4_4_ = -(uint)(r0.lly != 0.0);
  auVar2._0_4_ = -(uint)(r0.llx != 0.0);
  auVar2._8_4_ = -(uint)(r0.urx != 0.0);
  auVar2._12_4_ = -(uint)(r0.ury != 0.0);
  iVar15 = movmskps(extraout_EAX,auVar2);
  if (iVar15 != 0) {
    __assert_fail("r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5e2,"void test_42(QPDF &, const char *)");
  }
  operator____qpdf((char *)&pl1,0x13df99);
  cVar12 = QPDFObjectHandle::isRectangle();
  if (cVar12 != '\0') {
    __assert_fail("!\"[1 2 3]\"_qpdf.isRectangle()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5e3,"void test_42(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
  operator____qpdf((char *)&m1,0x13df99);
  QPDFObjectHandle::getArrayAsRectangle();
  r1.urx = (double)local_278._M_allocated_capacity;
  r1.ury = (double)local_278._8_8_;
  r1.llx = (double)_pl1;
  r1.lly = (double)_Stack_280._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m1.b);
  auVar3._4_4_ = -(uint)(r0.lly != 0.0);
  auVar3._0_4_ = -(uint)(r0.llx != 0.0);
  auVar3._8_4_ = -(uint)(r0.urx != 0.0);
  auVar3._12_4_ = -(uint)(r0.ury != 0.0);
  iVar15 = movmskps(extraout_EAX_00,auVar3);
  if (iVar15 != 0) {
    __assert_fail("r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5e5,"void test_42(QPDF &, const char *)");
  }
  operator____qpdf((char *)&pl1,0x13dfbf);
  cVar12 = QPDFObjectHandle::isRectangle();
  if (cVar12 != '\0') {
    __assert_fail("!\"[1 2 false 4]\"_qpdf.isRectangle()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5e6,"void test_42(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
  operator____qpdf((char *)&m1,0x13dfbf);
  QPDFObjectHandle::getArrayAsRectangle();
  r1.urx = (double)local_278._M_allocated_capacity;
  r1.ury = (double)local_278._8_8_;
  r1.llx = (double)_pl1;
  r1.lly = (double)_Stack_280._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m1.b);
  auVar4._4_4_ = -(uint)(r0.lly != 0.0);
  auVar4._0_4_ = -(uint)(r0.llx != 0.0);
  auVar4._8_4_ = -(uint)(r0.urx != 0.0);
  auVar4._12_4_ = -(uint)(r0.ury != 0.0);
  iVar15 = movmskps(extraout_EAX_01,auVar4);
  if (iVar15 != 0) {
    __assert_fail("r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5e8,"void test_42(QPDF &, const char *)");
  }
  _pl1 = (pointer)0x3ff3333333333333;
  _Stack_280._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x400b333333333333;
  local_278._M_allocated_capacity = 0x4016666666666666;
  local_278._8_8_ = (element_type *)0x401f333333333333;
  local_268._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4022333333333333;
  aaStack_260[0]._M_allocated_capacity = 2.3;
  QPDFObjectHandle::newFromMatrix((Matrix *)&matrix);
  uVar16 = QPDFObjectHandle::getArrayAsMatrix();
  auVar25._4_4_ = -(uint)(m1.b <= 3.39);
  auVar25._0_4_ = -(uint)(m1.a <= 1.19);
  auVar25._8_4_ = -(uint)(m1.c <= 5.59);
  auVar25._12_4_ = -(uint)(m1.d <= 7.79);
  auVar5._4_4_ = -(uint)(3.41 <= m1.b);
  auVar5._0_4_ = -(uint)(1.21 <= m1.a);
  auVar5._8_4_ = -(uint)(5.61 <= m1.c);
  auVar5._12_4_ = -(uint)(7.81 <= m1.d);
  iVar15 = movmskps(uVar16,auVar25 | auVar5);
  if ((((iVar15 != 0) || (9.11 <= m1.e)) || (2.31 <= m1.f)) || ((m1.e <= 9.09 || (m1.f <= 2.29)))) {
    __assert_fail("m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 && m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5ef,"void test_42(QPDF &, const char *)");
  }
  cVar12 = QPDFObjectHandle::isMatrix();
  if (cVar12 == '\0') {
    __assert_fail("matrix.isMatrix()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5f0,"void test_42(QPDF &, const char *)");
  }
  QPDFMatrix::QPDFMatrix((QPDFMatrix *)&pl1,1.2,3.4,5.6,7.8,9.1,2.3);
  QPDFObjectHandle::newFromMatrix((QPDFMatrix *)&local_1b8);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&matrix,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_1b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b8._M_string_length);
  uVar16 = QPDFObjectHandle::getArrayAsMatrix();
  m1.e = (double)local_268._M_pi;
  m1.f = (double)aaStack_260[0]._0_8_;
  m1.c = (double)local_278._M_allocated_capacity;
  m1.d = (double)local_278._8_8_;
  m1.a = (double)_pl1;
  m1.b = (double)_Stack_280._M_pi;
  auVar26._4_4_ = -(uint)((double)_Stack_280._M_pi <= 3.39);
  auVar26._0_4_ = -(uint)((double)_pl1 <= 1.19);
  auVar26._8_4_ = -(uint)((double)local_278._M_allocated_capacity <= 5.59);
  auVar26._12_4_ = -(uint)((double)local_278._8_8_ <= 7.79);
  auVar10._4_4_ = -(uint)(3.41 <= (double)_Stack_280._M_pi);
  auVar10._0_4_ = -(uint)(1.21 <= (double)_pl1);
  auVar10._8_4_ = -(uint)(5.61 <= (double)local_278._M_allocated_capacity);
  auVar10._12_4_ = -(uint)(7.81 <= (double)local_278._8_8_);
  iVar15 = movmskps(uVar16,auVar26 | auVar10);
  if (((iVar15 != 0) || (9.11 <= (double)local_268._M_pi)) ||
     ((2.31 <= (double)aaStack_260[0]._0_8_ ||
      (((double)local_268._M_pi <= 9.09 || ((double)aaStack_260[0]._0_8_ <= 2.29)))))) {
    __assert_fail("m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 && m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5f5,"void test_42(QPDF &, const char *)");
  }
  cVar12 = QPDFObjectHandle::isMatrix();
  if (cVar12 == '\0') {
    __assert_fail("matrix.isMatrix()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5f6,"void test_42(QPDF &, const char *)");
  }
  operator____qpdf((char *)&pl1,0x13df32);
  cVar12 = QPDFObjectHandle::isMatrix();
  if (cVar12 != '\0') {
    __assert_fail("!\"[1 2 3 4 5]\"_qpdf.isMatrix()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5f7,"void test_42(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
  operator____qpdf((char *)&local_1b8,0x13df32);
  QPDFObjectHandle::getArrayAsMatrix();
  m1.e = (double)local_268._M_pi;
  m1.f = (double)aaStack_260[0]._0_8_;
  m1.c = (double)local_278._M_allocated_capacity;
  m1.d = (double)local_278._8_8_;
  m1.a = (double)_pl1;
  m1.b = (double)_Stack_280._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b8._M_string_length);
  auVar6._4_4_ = -(uint)(m1.b != 0.0);
  auVar6._0_4_ = -(uint)(m1.a != 0.0);
  auVar6._8_4_ = -(uint)(m1.c != 0.0);
  auVar6._12_4_ = -(uint)(m1.d != 0.0);
  iVar15 = movmskps(extraout_EAX_02,auVar6);
  if ((((iVar15 != 0) || (m1.e != 0.0)) || (NAN(m1.e))) || ((m1.f != 0.0 || (NAN(m1.f))))) {
    __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5f9,"void test_42(QPDF &, const char *)");
  }
  operator____qpdf((char *)&pl1,0x13e11e);
  cVar12 = QPDFObjectHandle::isMatrix();
  if (cVar12 != '\0') {
    __assert_fail("!\"[1 2 3 4 5 6 7]\"_qpdf.isMatrix()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5fa,"void test_42(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
  operator____qpdf((char *)&local_1b8,0x13e11e);
  QPDFObjectHandle::getArrayAsMatrix();
  m1.e = (double)local_268._M_pi;
  m1.f = (double)aaStack_260[0]._0_8_;
  m1.c = (double)local_278._M_allocated_capacity;
  m1.d = (double)local_278._8_8_;
  m1.a = (double)_pl1;
  m1.b = (double)_Stack_280._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b8._M_string_length);
  auVar7._4_4_ = -(uint)(m1.b != 0.0);
  auVar7._0_4_ = -(uint)(m1.a != 0.0);
  auVar7._8_4_ = -(uint)(m1.c != 0.0);
  auVar7._12_4_ = -(uint)(m1.d != 0.0);
  iVar15 = movmskps(extraout_EAX_03,auVar7);
  if (((iVar15 != 0) || (m1.e != 0.0)) || ((NAN(m1.e) || ((m1.f != 0.0 || (NAN(m1.f))))))) {
    __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5fc,"void test_42(QPDF &, const char *)");
  }
  operator____qpdf((char *)&pl1,0x13e151);
  cVar12 = QPDFObjectHandle::isMatrix();
  if (cVar12 != '\0') {
    __assert_fail("!\"[1 2 3 false 5 6 7]\"_qpdf.isMatrix()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5fd,"void test_42(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
  operator____qpdf((char *)&local_1b8,0x13e151);
  QPDFObjectHandle::getArrayAsMatrix();
  m1.e = (double)local_268._M_pi;
  m1.f = (double)aaStack_260[0]._0_8_;
  m1.c = (double)local_278._M_allocated_capacity;
  m1.d = (double)local_278._8_8_;
  m1.a = (double)_pl1;
  m1.b = (double)_Stack_280._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b8._M_string_length);
  auVar8._4_4_ = -(uint)(m1.b != 0.0);
  auVar8._0_4_ = -(uint)(m1.a != 0.0);
  auVar8._8_4_ = -(uint)(m1.c != 0.0);
  auVar8._12_4_ = -(uint)(m1.d != 0.0);
  iVar15 = movmskps(extraout_EAX_04,auVar8);
  if ((((iVar15 != 0) || (m1.e != 0.0)) || (NAN(m1.e))) || ((m1.f != 0.0 || (NAN(m1.f))))) {
    __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5ff,"void test_42(QPDF &, const char *)");
  }
  operator____qpdf((char *)&pl1,0x13e2e8);
  cVar12 = QPDFObjectHandle::isMatrix();
  if (cVar12 != '\0') {
    __assert_fail("!\"42\"_qpdf.isMatrix()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x600,"void test_42(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_280);
  operator____qpdf((char *)&local_1b8,0x13e2e8);
  QPDFObjectHandle::getArrayAsMatrix();
  m1.e = (double)local_268._M_pi;
  m1.f = (double)aaStack_260[0]._0_8_;
  m1.c = (double)local_278._M_allocated_capacity;
  m1.d = (double)local_278._8_8_;
  m1.a = (double)_pl1;
  m1.b = (double)_Stack_280._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b8._M_string_length);
  auVar9._4_4_ = -(uint)(m1.b != 0.0);
  auVar9._0_4_ = -(uint)(m1.a != 0.0);
  auVar9._8_4_ = -(uint)(m1.c != 0.0);
  auVar9._12_4_ = -(uint)(m1.d != 0.0);
  iVar15 = movmskps(extraout_EAX_05,auVar9);
  if (((iVar15 != 0) || (m1.e != 0.0)) || ((NAN(m1.e) || ((m1.f != 0.0 || (NAN(m1.f))))))) {
    __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x602,"void test_42(QPDF &, const char *)");
  }
  uninitialized.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  uninitialized.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cVar12 = QPDFObjectHandle::isInteger();
  if (cVar12 != '\0') {
    __assert_fail("!uninitialized.isInteger()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x607,"void test_42(QPDF &, const char *)");
  }
  cVar12 = QPDFObjectHandle::isDictionary();
  if (cVar12 != '\0') {
    __assert_fail("!uninitialized.isDictionary()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x608,"void test_42(QPDF &, const char *)");
  }
  cVar12 = QPDFObjectHandle::isScalar();
  if (cVar12 != '\0') {
    __assert_fail("!uninitialized.isScalar()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x609,"void test_42(QPDF &, const char *)");
  }
  QPDF::newIndirectNull();
  indirect_og = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  QVar20 = qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&indirect.super_BaseHandle);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_a8,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&array);
  QVar27.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8;
  QVar27.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)QVar20;
  QPDF::replaceObject((QPDFObjGen)pdf,QVar27);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  cVar12 = QPDFObjectHandle::isIndirect();
  if (cVar12 == '\0') {
    __assert_fail("array.isIndirect()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x60f,"void test_42(QPDF &, const char *)");
  }
  cVar12 = QPDFObjectHandle::isArray();
  if (cVar12 == '\0') {
    __assert_fail("indirect.isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x610,"void test_42(QPDF &, const char *)");
  }
  uVar21 = QPDFObjectHandle::getObjGen();
  if ((indirect_og.obj != (int)uVar21) || (indirect_og.gen != (int)((ulong)uVar21 >> 0x20))) {
    __assert_fail("array.getObjGen() == indirect_og",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x611,"void test_42(QPDF &, const char *)");
  }
  cVar12 = QPDFObjectHandle::isArray();
  if (cVar12 == '\0') {
    __assert_fail("array.isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x612,"void test_42(QPDF &, const char *)");
  }
  cVar12 = QPDFObjectHandle::isArray();
  if (cVar12 != '\0') {
    QPDFObjectHandle::unparse_abi_cxx11_();
    QPDFObjGen::unparse_abi_cxx11_(&local_108,&indirect_og,' ');
    std::operator+(&local_1b8,&local_108," R");
    _Var14 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &pl1,&local_1b8);
    if (!_Var14) {
      __assert_fail("indirect.unparse() == indirect_og.unparse(\' \') + \" R\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0x614,"void test_42(QPDF &, const char *)");
    }
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&pl1);
    Pl_Buffer::Pl_Buffer(&pl1,"",(Pipeline *)0x0);
    QPDFObjectHandle::writeJSON((int)&array,(Pipeline *)0x2,SUB81(&pl1,0),1);
    Pl_Buffer::finish();
    Pl_Buffer::getString_abi_cxx11_();
    QPDFObjGen::unparse_abi_cxx11_(&local_98,&indirect_og,' ');
    std::operator+(&local_78,"\"",&local_98);
    std::operator+(&local_108,&local_78," R\"");
    _Var14 = std::operator==(&local_1b8,&local_108);
    if (!_Var14) {
      __assert_fail("pl1.getString() == std::string(\"\\\"\" + indirect_og.unparse(\' \') + \" R\\\"\")"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0x619,"void test_42(QPDF &, const char *)");
    }
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_1b8);
    operator____qpdf((char *)&local_1b8,0x13e2e8);
    QPDFObjectHandle::setArrayItem((int)&array,(QPDFObjectHandle *)0x1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b8._M_string_length);
    QPDFObjectHandle::getArrayItem((int)&local_1b8);
    lVar18 = QPDFObjectHandle::getIntValue();
    if (lVar18 != 0x2a) {
      __assert_fail("indirect.getArrayItem(1).getIntValue() == 42",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0x61c,"void test_42(QPDF &, const char *)");
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1b8._M_string_length);
    QVar20 = qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&indirect.super_BaseHandle);
    operator____qpdf(local_d8,0x13e2e8);
    QVar28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8;
    QVar28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)QVar20;
    QPDF::replaceObject((QPDFObjGen)pdf,QVar28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0);
    cVar12 = QPDFObjectHandle::isInteger();
    if (cVar12 != '\0') {
      Pl_Buffer::~Pl_Buffer(&pl1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&indirect.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&uninitialized.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&matrix.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rect.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&page.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&null.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&integer.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dictionary.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&array.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&qtest.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    __assert_fail("array.isInteger()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x61f,"void test_42(QPDF &, const char *)");
  }
  __assert_fail("indirect.isArray()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0x613,"void test_42(QPDF &, const char *)");
}

Assistant:

static void
test_42(QPDF& pdf, char const* arg2)
{
    // Access objects as wrong type. This test case is crafted to work with object-types.pdf.
    QPDFObjectHandle qtest = pdf.getTrailer().getKey("/QTest");
    QPDFObjectHandle array = qtest.getKey("/Dictionary").getKey("/Key2");
    QPDFObjectHandle dictionary = qtest.getKey("/Dictionary");
    QPDFObjectHandle integer = qtest.getKey("/Integer");
    QPDFObjectHandle null = QPDFObjectHandle::newNull();
    assert(array.isArray());
    {
        // Exercise iterators directly
        auto ai = array.aitems();
        auto i = ai.begin();
        assert(i->getName() == "/Item0");
        auto& i_value = *i;
        --i;
        assert(i->getName() == "/Item0");
        ++i;
        ++i;
        ++i;
        assert(i == ai.end());
        ++i;
        assert(i == ai.end());
        assert(!i_value);
        --i;
        assert(i_value.getName() == "/Item2");
        assert(i->getName() == "/Item2");
    }
    assert(dictionary.isDictionary());
    {
        // Exercise iterators directly
        auto di = dictionary.ditems();
        auto i = di.begin();
        assert(i->first == "/Key1");
        auto& i_value = *i;
        assert(i->second.getName() == "/Value1");
        ++i;
        ++i;
        assert(i == di.end());
        assert(!i_value.second);
    }
    assert("" == qtest.getStringValue());
    array.getArrayItem(-1).assertNull();
    array.getArrayItem(16059).assertNull();
    integer.getArrayItem(0).assertNull();
    integer.appendItem(null);
    array.eraseItem(-1);
    array.eraseItem(16059);
    array.insertItem(42, "/Dontpanic"_qpdf);
    array.setArrayItem(42, "/Dontpanic"_qpdf);
    integer.eraseItem(0);
    integer.insertItem(0, null);
    integer.setArrayFromVector(std::vector<QPDFObjectHandle>());
    integer.setArrayItem(0, null);
    assert(0 == integer.getArrayNItems());
    assert(integer.getArrayAsVector().empty());
    assert(false == integer.getBoolValue());
    assert(integer.getDictAsMap().empty());
    assert(integer.getKeys().empty());
    assert(false == integer.hasKey("/Potato"));
    integer.removeKey("/Potato");
    integer.replaceKey("/Potato", null);
    integer.replaceKey("/Potato", QPDFObjectHandle::newInteger(1));
    null.getKeyIfDict("/Integer").getKeyIfDict("/Potato").assertNull();
    qtest.getKey("/Integer").getKeyIfDict("/Potato");
    qtest.getKey("/Integer").getKey("/Potato");
    assert(integer.getInlineImageValue().empty());
    assert(0 == dictionary.getIntValue());
    assert("/QPDFFakeName" == integer.getName());
    assert("QPDFFAKE" == integer.getOperatorValue());
    assert("0.0" == dictionary.getRealValue());
    assert(integer.getStringValue().empty());
    assert(integer.getUTF8Value().empty());
    assert(0.0 == dictionary.getNumericValue());
    // Make sure error messages are okay for nested values
    std::cerr << "One error\n";
    assert(array.getArrayItem(0).getStringValue().empty());
    std::cerr << "One error\n";
    assert(dictionary.getKey("/Quack").getStringValue().empty());
    assert(dictionary.getKeyIfDict("/Quack").getStringValue().empty());
    assert(array.getArrayItem(1).isDictionary());
    assert(array.getArrayItem(1).getKey("/K").isArray());
    assert(array.getArrayItem(1).getKey("/K").getArrayItem(0).isName());
    assert("/V" == array.getArrayItem(1).getKey("/K").getArrayItem(0).getName());
    std::cerr << "Two errors\n";
    assert(array.getArrayItem(16059).getStringValue().empty());
    std::cerr << "One error\n";
    array.getArrayItem(1).getKey("/K").getArrayItem(0).getStringValue();
    // Stream dictionary
    QPDFObjectHandle page = pdf.getAllPages().at(0);
    assert("/QPDFFakeName" == page.getKey("/Contents").getDict().getKey("/Potato").getName());
    // Rectangle
    QPDFObjectHandle::Rectangle r0 = integer.getArrayAsRectangle();
    assert((r0.llx == 0) && (r0.lly == 0) && (r0.urx == 0) && (r0.ury == 0));
    QPDFObjectHandle rect =
        QPDFObjectHandle::newFromRectangle(QPDFObjectHandle::Rectangle(1.2, 3.4, 5.6, 7.8));
    QPDFObjectHandle::Rectangle r1 = rect.getArrayAsRectangle();
    assert(
        (r1.llx > 1.19) && (r1.llx < 1.21) && (r1.lly > 3.39) && (r1.lly < 3.41) &&
        (r1.urx > 5.59) && (r1.urx < 5.61) && (r1.ury > 7.79) && (r1.ury < 7.81));
    assert(!"[1 2 3 4 5]"_qpdf.isRectangle());
    r1 = "[1 2 3 4 5]"_qpdf.getArrayAsRectangle();
    assert(r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0);
    assert(!"[1 2 3]"_qpdf.isRectangle());
    r1 = "[1 2 3]"_qpdf.getArrayAsRectangle();
    assert(r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0);
    assert(!"[1 2 false 4]"_qpdf.isRectangle());
    r1 = "[1 2 false 4]"_qpdf.getArrayAsRectangle();
    assert(r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0);
    // Matrix
    auto matrix =
        QPDFObjectHandle::newFromMatrix(QPDFObjectHandle::Matrix{1.2, 3.4, 5.6, 7.8, 9.1, 2.3});
    auto m1 = matrix.getArrayAsMatrix();
    assert(
        m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 &&
        m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31);
    assert(matrix.isMatrix());
    matrix = QPDFObjectHandle::newFromMatrix(QPDFMatrix{1.2, 3.4, 5.6, 7.8, 9.1, 2.3});
    m1 = matrix.getArrayAsMatrix();
    assert(
        m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 &&
        m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31);
    assert(matrix.isMatrix());
    assert(!"[1 2 3 4 5]"_qpdf.isMatrix());
    m1 = "[1 2 3 4 5]"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);
    assert(!"[1 2 3 4 5 6 7]"_qpdf.isMatrix());
    m1 = "[1 2 3 4 5 6 7]"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);
    assert(!"[1 2 3 false 5 6 7]"_qpdf.isMatrix());
    m1 = "[1 2 3 false 5 6 7]"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);
    assert(!"42"_qpdf.isMatrix());
    m1 = "42"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);

    // Uninitialized
    QPDFObjectHandle uninitialized;
    assert(!uninitialized);
    assert(!uninitialized.isInteger());
    assert(!uninitialized.isDictionary());
    assert(!uninitialized.isScalar());

    // Reference
    auto indirect = pdf.newIndirectNull();
    QPDFObjGen indirect_og{indirect.getObjGen()};
    pdf.replaceObject(indirect, array);
    assert(array.isIndirect());
    assert(indirect.isArray());
    assert(array.getObjGen() == indirect_og);
    assert(array.isArray());
    assert(indirect.isArray());
    assert(indirect.unparse() == indirect_og.unparse(' ') + " R");

    auto pl1 = Pl_Buffer("");
    array.writeJSON(2, &pl1, true);
    pl1.finish();
    assert(pl1.getString() == std::string("\"" + indirect_og.unparse(' ') + " R\""));

    array.setArrayItem(1, "42"_qpdf);
    assert(indirect.getArrayItem(1).getIntValue() == 42);

    pdf.replaceObject(indirect, "42"_qpdf);
    assert(array.isInteger());
}